

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O0

double __thiscall
opengv::absolute_pose::modules::Epnp::reprojection_error(Epnp *this,double (*R) [3],double *t)

{
  double dVar1;
  double *v2;
  double *in_RDX;
  double *in_RSI;
  Epnp *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double v;
  double u;
  double ve;
  double ue;
  double inv_Zc;
  double Yc;
  double Xc;
  double *pw;
  int i;
  double sum2;
  int local_24;
  double local_20;
  
  local_20 = 0.0;
  for (local_24 = 0; local_24 < in_RDI->number_of_correspondences; local_24 = local_24 + 1) {
    v2 = in_RDI->pws + local_24 * 3;
    dVar2 = dot(in_RDI,in_RSI,v2);
    dVar5 = *in_RDX;
    dVar3 = dot(in_RDI,in_RSI + 3,v2);
    dVar1 = in_RDX[1];
    dVar4 = dot(in_RDI,in_RSI + 6,v2);
    auVar6._0_8_ = 1.0 / (dVar4 + in_RDX[2]);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = in_RDI->uc;
    auVar6._8_8_ = 0;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = in_RDI->fu * (dVar2 + dVar5);
    auVar9 = vfmadd213sd_fma(auVar6,auVar9,auVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = in_RDI->vc;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = auVar6._0_8_;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = in_RDI->fv * (dVar3 + dVar1);
    auVar6 = vfmadd213sd_fma(auVar7,auVar10,auVar13);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = in_RDI->us[local_24 << 1] - auVar9._0_8_;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = in_RDI->us[local_24 << 1] - auVar9._0_8_;
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         (in_RDI->us[local_24 * 2 + 1] - auVar6._0_8_) *
         (in_RDI->us[local_24 * 2 + 1] - auVar6._0_8_);
    auVar9 = vfmadd213sd_fma(auVar8,auVar11,auVar14);
    dVar5 = sqrt(auVar9._0_8_);
    local_20 = dVar5 + local_20;
  }
  return local_20 / (double)in_RDI->number_of_correspondences;
}

Assistant:

double
opengv::absolute_pose::modules::Epnp::reprojection_error(
    const double R[3][3],
    const double t[3])
{
  double sum2 = 0.0;

  for(int i = 0; i < number_of_correspondences; i++)
  {
    double * pw = pws + 3 * i;
    double Xc = dot(R[0], pw) + t[0];
    double Yc = dot(R[1], pw) + t[1];
    double inv_Zc = 1.0 / (dot(R[2], pw) + t[2]);
    double ue = uc + fu * Xc * inv_Zc;
    double ve = vc + fv * Yc * inv_Zc;
    double u = us[2 * i], v = us[2 * i + 1];

    sum2 += sqrt( (u - ue) * (u - ue) + (v - ve) * (v - ve) );
  }

  return sum2 / number_of_correspondences;
}